

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  int iVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  int iVar5;
  float fVar6;
  
  pIVar2 = GImGui;
  if ((1 < (GImGui->CurrentWindowStack).Size) || (GImGui->FrameScopePushedImplicitWindow == false))
  {
    pIVar4 = GImGui->CurrentWindow;
    if ((pIVar4->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
      EndColumns();
    }
    PopClipRect();
    if ((pIVar4->Flags & 0x1000000) == 0) {
      LogFinish();
    }
    iVar1 = (pIVar2->CurrentWindowStack).Size;
    iVar5 = iVar1 + -1;
    (pIVar2->CurrentWindowStack).Size = iVar5;
    if ((pIVar4->Flags & 0x4000000) != 0) {
      (pIVar2->BeginPopupStack).Size = (pIVar2->BeginPopupStack).Size + -1;
    }
    pIVar3 = GImGui;
    if (iVar5 == 0) {
      pIVar4 = (ImGuiWindow *)0x0;
    }
    else {
      pIVar4 = (pIVar2->CurrentWindowStack).Data[(long)iVar1 + -2];
    }
    GImGui->CurrentWindow = pIVar4;
    if (pIVar4 != (ImGuiWindow *)0x0) {
      fVar6 = pIVar3->FontBaseSize * pIVar4->FontWindowScale;
      (pIVar3->DrawListSharedData).FontSize = fVar6;
      pIVar3->FontSize = fVar6;
    }
  }
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;

    if (g.CurrentWindowStack.Size <= 1 && g.FrameScopePushedImplicitWindow)
    {
        IM_ASSERT(g.CurrentWindowStack.Size > 1 && "Calling End() too many times!");
        return; // FIXME-ERRORHANDLING
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    ImGuiWindow* window = g.CurrentWindow;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop from window stack
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}